

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  bool bVar7;
  char cVar8;
  numpunct *pnVar9;
  char *pcVar10;
  buffer_appender<char> bVar11;
  uint uVar12;
  ulong uVar13;
  buffer<char> *buf;
  uint uVar14;
  uint uVar15;
  long *plVar16;
  uint uVar17;
  long *plVar18;
  long *plVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong size;
  int iVar25;
  string groups;
  char digits [40];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  char *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar9 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar9 + 0x20))(&local_2a8,pnVar9);
  std::locale::~locale((locale *)&local_248);
  if (local_2a0 == 0) {
    on_dec(this);
  }
  else {
    plVar5 = (locale *)(this->locale).locale_;
    if (plVar5 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar5);
    }
    pnVar9 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar9 + 0x18))(pnVar9);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 != '\0') {
      uVar17 = this->abs_value;
      uVar15 = 0x1f;
      if ((uVar17 | 1) != 0) {
        for (; (uVar17 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar15 * 2);
      uVar24 = (uint)uVar4 -
               (uint)(uVar17 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar4 * 4));
      iVar25 = -(uint)(uVar17 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar4 * 4));
      plVar16 = (long *)((long)local_2a8 + local_2a0);
      plVar19 = local_2a8;
      uVar15 = uVar24;
      uVar12 = uVar24;
      if (local_2a0 != 0) {
        plVar18 = local_2a8;
        lVar22 = local_2a0;
        uVar14 = uVar24;
        do {
          cVar2 = (char)*plVar18;
          uVar23 = uVar12 - (int)cVar2;
          plVar19 = plVar18;
          uVar15 = uVar14;
          if ((uVar23 == 0 || (int)uVar12 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar14 = uVar14 + 1;
          plVar18 = (long *)((long)plVar18 + 1);
          lVar22 = lVar22 + -1;
          plVar19 = plVar16;
          uVar15 = (int)local_2a0 + iVar25 + (uint)uVar4;
          uVar12 = uVar23;
        } while (lVar22 != 0);
      }
      if (plVar19 == plVar16) {
        uVar15 = uVar15 + (int)(uVar12 - 1) / (int)*(char *)((long)plVar16 + -1);
      }
      pcVar10 = local_278 + (int)uVar24;
      uVar12 = uVar17;
      if (99 < uVar17) {
        do {
          uVar17 = uVar12 / 100;
          *(undefined2 *)(pcVar10 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar12 % 100) * 2);
          pcVar10 = pcVar10 + -2;
          bVar7 = 9999 < uVar12;
          uVar12 = uVar12 / 100;
        } while (bVar7);
      }
      if (uVar17 < 10) {
        pcVar10[-1] = (byte)uVar17 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar10 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (ulong)uVar17 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00147e78;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar15 = uVar15 + this->prefix_size;
      if (-1 < (int)uVar15) {
        size = (ulong)uVar15;
        if (500 < uVar15) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
        }
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (size <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = size;
        }
        pcVar10 = local_248.super_buffer<char>.ptr_ + (size - 1);
        if (1 < (int)uVar24) {
          uVar20 = (ulong)uVar24;
          iVar21 = iVar25 + (uint)uVar4 + 1;
          iVar25 = 0;
          plVar16 = local_2a8;
          do {
            uVar20 = uVar20 - 1;
            pcVar1 = pcVar10 + -1;
            *pcVar10 = local_278[uVar20 & 0xffffffff];
            cVar2 = (char)*plVar16;
            if (0 < cVar2) {
              iVar25 = iVar25 + 1;
              if ((cVar2 != '\x7f') && (iVar25 % (int)cVar2 == 0)) {
                if ((long *)((long)plVar16 + 1) != (long *)((long)local_2a8 + local_2a0)) {
                  iVar25 = 0;
                  plVar16 = (long *)((long)plVar16 + 1);
                }
                pcVar10[-1] = cVar8;
                pcVar1 = pcVar10 + -2;
              }
            }
            pcVar10 = pcVar1;
            iVar21 = iVar21 + -1;
          } while (2 < iVar21);
        }
        *pcVar10 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar10[-1] = '-';
        }
        pbVar6 = this->specs;
        uVar20 = (ulong)pbVar6->width;
        if (-1 < (long)uVar20) {
          local_280 = local_248.super_buffer<char>.ptr_;
          uVar13 = 0;
          if (size <= uVar20) {
            uVar13 = uVar20 - size;
          }
          bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar6->field_0x9 & 0xf));
          local_288 = this;
          if (*(ulong *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + size + (pbVar6->fill).size_ * uVar13) {
            (*(code *)**(undefined8 **)
                        bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar20 = uVar13 >> (bVar3 & 0x3f);
          bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar11,uVar20,&pbVar6->fill);
          bVar11 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (local_280,local_280 + size,bVar11);
          bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar11,uVar13 - uVar20,&pbVar6->fill);
          (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_0011a8e7;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_0011a8e7:
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }